

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *interfaceNode)

{
  ushort uVar1;
  char *__s;
  ElementCount index;
  WirePointer id;
  uint64_t uVar2;
  ElementCount EVar3;
  ulong elementCount;
  bool bVar4;
  bool bVar5;
  Reader method;
  Array<bool> sawCodeOrder_heap;
  Reader methods;
  anon_class_8_1_60e9c21f _kjContextFunc435;
  Fault f;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_loader_c__:435:7)>
  _kjContext435;
  bool sawCodeOrder_stack [32];
  StructReader local_1c8;
  ulong local_190;
  undefined8 *local_188;
  char *local_180;
  ArrayPtr<const_char> local_178;
  WirePointer *local_168;
  int local_160;
  char *local_158;
  ulong uStack_150;
  undefined8 *local_148;
  ListReader local_138;
  Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
  *local_100;
  StructReader *local_f8;
  anon_class_8_1_6f242a07 local_f0;
  ArrayPtr<const_char> local_e8;
  WirePointer *local_d8;
  int local_d0;
  anon_class_16_2_3f8e8a0c local_b8;
  undefined1 local_a8 [24];
  ElementCount local_90;
  StructReader **local_60;
  char local_58 [40];
  
  bVar4 = 4 < (interfaceNode->_reader).pointerCount;
  local_138.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
  if (!bVar4) {
    local_138.ptr = (byte *)(WirePointer *)0x0;
  }
  local_138.elementCount = (interfaceNode->_reader).nestingLimit;
  if (bVar4) {
    local_138.segment._0_4_ = *(undefined4 *)&(interfaceNode->_reader).segment;
    local_138.segment._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).segment + 4);
    local_138.capTable._0_4_ = *(undefined4 *)&(interfaceNode->_reader).capTable;
    local_138.capTable._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).capTable + 4);
  }
  else {
    local_138.segment._0_4_ = 0;
    local_138.segment._4_4_ = 0;
    local_138.capTable._0_4_ = 0;
    local_138.capTable._4_4_ = 0;
    local_138.elementCount = 0x7fffffff;
  }
  _::PointerReader::getList
            ((ListReader *)local_a8,(PointerReader *)&local_138,INLINE_COMPOSITE,(word *)0x0);
  if (local_90 != 0) {
    EVar3 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_138,(ListReader *)local_a8,EVar3);
      if (local_138.structDataSize < 0x40) {
        id.offsetAndKind.value = 0;
        id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        id = *(WirePointer *)local_138.ptr;
      }
      validateTypeId(this,(uint64_t)id,INTERFACE);
      local_d8 = (WirePointer *)CONCAT44(local_138.step,local_138.elementCount);
      local_d0 = local_138.nestingLimit;
      if (local_138.structPointerCount == 0) {
        local_d8 = (WirePointer *)0x0;
        local_d0 = 0x7fffffff;
      }
      local_e8.ptr._0_4_ = 0;
      local_e8.ptr._4_4_ = 0;
      local_e8.size_._0_4_ = 0;
      local_e8.size_._4_4_ = 0;
      if (local_138.structPointerCount != 0) {
        local_e8.ptr._0_4_ = local_138.segment._0_4_;
        local_e8.ptr._4_4_ = local_138.segment._4_4_;
        local_e8.size_._0_4_ = local_138.capTable._0_4_;
        local_e8.size_._4_4_ = local_138.capTable._4_4_;
      }
      _::PointerReader::getStruct(&local_1c8,(PointerReader *)&local_e8,(word *)0x0);
      validate(this,(Reader *)&local_1c8);
      EVar3 = EVar3 + 1;
    } while (local_90 != EVar3);
  }
  bVar4 = (interfaceNode->_reader).pointerCount < 4;
  local_a8._16_8_ = (interfaceNode->_reader).pointers + 3;
  if (bVar4) {
    local_a8._16_8_ = (WirePointer *)0x0;
  }
  local_90 = (interfaceNode->_reader).nestingLimit;
  if (bVar4) {
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_90 = 0x7fffffff;
  }
  else {
    local_a8._0_4_ = *(undefined4 *)&(interfaceNode->_reader).segment;
    local_a8._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).segment + 4);
    local_a8._8_4_ = *(undefined4 *)&(interfaceNode->_reader).capTable;
    local_a8._12_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).capTable + 4);
  }
  _::PointerReader::getList(&local_138,(PointerReader *)local_a8,INLINE_COMPOSITE,(word *)0x0);
  elementCount = (ulong)local_138.elementCount;
  if (elementCount < 0x21) {
    local_158 = (char *)0x0;
    uStack_150 = 0;
    local_148 = (undefined8 *)0x0;
    __s = local_58;
    local_188 = (undefined8 *)0x0;
  }
  else {
    __s = (char *)kj::_::HeapArrayDisposer::allocateImpl
                            (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
    local_188 = &kj::_::HeapArrayDisposer::instance;
    local_148 = &kj::_::HeapArrayDisposer::instance;
    local_158 = __s;
    uStack_150 = elementCount;
  }
  local_190 = uStack_150;
  local_180 = local_158;
  memset(__s,0,elementCount);
  if (local_138.elementCount != 0) {
    local_100 = (Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                 *)&this->members;
    EVar3 = local_138.elementCount - 1;
    index = 0;
    do {
      _::ListReader::getStructElement(&local_1c8,&local_138,index);
      local_f8 = &local_1c8;
      kj::_::Debug::Context::Context((Context *)local_a8);
      local_a8._0_8_ = &PTR__Context_00208018;
      local_60 = &local_f8;
      local_d0 = local_1c8.nestingLimit;
      local_d8 = local_1c8.pointers;
      if (local_1c8.pointerCount == 0) {
        local_d8 = (WirePointer *)0x0;
        local_d0 = 0x7fffffff;
      }
      local_e8.ptr._0_4_ = 0;
      local_e8.ptr._4_4_ = 0;
      local_e8.size_._0_4_ = 0;
      local_e8.size_._4_4_ = 0;
      if (local_1c8.pointerCount != 0) {
        local_e8.ptr._0_4_ = local_1c8.segment._0_4_;
        local_e8.ptr._4_4_ = local_1c8.segment._4_4_;
        local_e8.size_._0_4_ = local_1c8.capTable._0_4_;
        local_e8.size_._4_4_ = local_1c8.capTable._4_4_;
      }
      local_178 = (ArrayPtr<const_char>)
                  _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_e8,(void *)0x0,0);
      local_b8.name = (StringPtr *)&local_178;
      local_d8 = (WirePointer *)CONCAT44(local_d8._4_4_,index);
      local_f0.update = &local_b8;
      local_e8 = local_178;
      local_b8.this = this;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                (local_100,(Entry *)&local_e8,&local_f0);
      if (local_1c8.dataSize < 0x10) {
        if ((local_138.elementCount == 0) || (*__s != '\0')) goto LAB_00195f9a;
        *__s = '\x01';
LAB_00195e82:
        uVar2 = 0;
LAB_00195e8f:
        validateTypeId(this,uVar2,STRUCT);
        local_168 = local_1c8.pointers + 2;
        local_178.ptr._0_4_ = local_1c8.segment._0_4_;
        local_178.ptr._4_4_ = local_1c8.segment._4_4_;
        local_178.size_._0_4_ = local_1c8.capTable._0_4_;
        local_178.size_._4_4_ = local_1c8.capTable._4_4_;
        local_160 = local_1c8.nestingLimit;
        if (local_1c8.pointerCount < 3) {
          local_168 = (WirePointer *)0x0;
          local_178.ptr._0_4_ = 0;
          local_178.ptr._4_4_ = 0;
          local_178.size_._0_4_ = 0;
          local_178.size_._4_4_ = 0;
          local_160 = 0x7fffffff;
        }
        _::PointerReader::getStruct
                  ((StructReader *)&local_e8,(PointerReader *)&local_178,(word *)0x0);
        validate(this,(Reader *)&local_e8);
        if (local_1c8.dataSize < 0xc0) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(uint64_t *)((long)local_1c8.data + 0x10);
        }
        validateTypeId(this,uVar2,STRUCT);
        local_168 = local_1c8.pointers + 3;
        local_178.ptr._0_4_ = local_1c8.segment._0_4_;
        local_178.ptr._4_4_ = local_1c8.segment._4_4_;
        local_178.size_._0_4_ = local_1c8.capTable._0_4_;
        local_178.size_._4_4_ = local_1c8.capTable._4_4_;
        local_160 = local_1c8.nestingLimit;
        if (local_1c8.pointerCount < 4) {
          local_168 = (WirePointer *)0x0;
          local_178.ptr._0_4_ = 0;
          local_178.ptr._4_4_ = 0;
          local_178.size_._0_4_ = 0;
          local_178.size_._4_4_ = 0;
          local_160 = 0x7fffffff;
        }
        _::PointerReader::getStruct
                  ((StructReader *)&local_e8,(PointerReader *)&local_178,(word *)0x0);
        validate(this,(Reader *)&local_e8);
        bVar4 = false;
      }
      else {
        uVar1 = *local_1c8.data;
        if ((uVar1 < local_138.elementCount) && (__s[uVar1] == '\0')) {
          __s[uVar1] = '\x01';
          if (local_1c8.dataSize < 0x80) goto LAB_00195e82;
          uVar2 = *(uint64_t *)((long)local_1c8.data + 8);
          goto LAB_00195e8f;
        }
LAB_00195f9a:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)&local_e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x1b8,FAILED,
                   "method.getCodeOrder() < methods.size() && !sawCodeOrder[method.getCodeOrder()]",
                   "\"invalid codeOrder\"",(char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault((Fault *)&local_e8);
        bVar4 = true;
      }
      kj::_::Debug::Context::~Context((Context *)local_a8);
      bVar5 = EVar3 != index;
      index = index + 1;
    } while (!bVar4 && bVar5);
  }
  if (local_180 != (char *)0x0) {
    local_158 = (char *)0x0;
    uStack_150 = 0;
    (**(code **)*local_188)(local_188,local_180,1,local_190,local_190,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Interface::Reader& interfaceNode) {
    for (auto extend: interfaceNode.getSuperclasses()) {
      validateTypeId(extend.getId(), schema::Node::INTERFACE);
      validate(extend.getBrand());
    }

    auto methods = interfaceNode.getMethods();
    KJ_STACK_ARRAY(bool, sawCodeOrder, methods.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    uint index = 0;
    for (auto method: methods) {
      KJ_CONTEXT("validating method", method.getName());
      validateMemberName(method.getName(), index++);

      VALIDATE_SCHEMA(method.getCodeOrder() < methods.size() &&
                      !sawCodeOrder[method.getCodeOrder()],
                      "invalid codeOrder");
      sawCodeOrder[method.getCodeOrder()] = true;

      validateTypeId(method.getParamStructType(), schema::Node::STRUCT);
      validate(method.getParamBrand());
      validateTypeId(method.getResultStructType(), schema::Node::STRUCT);
      validate(method.getResultBrand());
    }
  }